

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeArrayBufferPrototype
               (DynamicObject *arrayBufferPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *arrayBufferPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayBufferPrototype,mode,2,0);
  this = RecyclableObject::GetScriptContext(&arrayBufferPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&arrayBufferPrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).arrayBufferConstructor);
  AddMember(this_00,arrayBufferPrototype,0x67,*ppRVar2);
  AddFunctionToLibraryObject
            (this_00,arrayBufferPrototype,0x150,(FunctionInfo *)ArrayBuffer::EntryInfo::Slice,2,
             '\x06');
  AddAccessorsToLibraryObject
            (this_00,arrayBufferPrototype,0x1a9,
             (FunctionInfo *)ArrayBuffer::EntryInfo::GetterByteLength,(FunctionInfo *)0x0);
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<12ul>(this_00,(char16 (*) [12])0x18bc1ea);
    AddMember(this_00,arrayBufferPrototype,0x1b,value,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(arrayBufferPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayBufferPrototype(DynamicObject* arrayBufferPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayBufferPrototype, mode, 2);

        ScriptContext* scriptContext = arrayBufferPrototype->GetScriptContext();
        JavascriptLibrary* library = arrayBufferPrototype->GetLibrary();
        library->AddMember(arrayBufferPrototype, PropertyIds::constructor, library->arrayBufferConstructor);

        library->AddFunctionToLibraryObject(arrayBufferPrototype, PropertyIds::slice, &ArrayBuffer::EntryInfo::Slice, 2);
        library->AddAccessorsToLibraryObject(arrayBufferPrototype, PropertyIds::byteLength, &ArrayBuffer::EntryInfo::GetterByteLength, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(arrayBufferPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("ArrayBuffer")), PropertyConfigurable);
        }

        arrayBufferPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }